

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

void stack_node_add_link(StackNode *self,StackLink link,SubtreePool *subtree_pool)

{
  ushort uVar1;
  int iVar2;
  _Bool _Var3;
  int32_t iVar4;
  int32_t iVar5;
  uint32_t uVar6;
  StackLink *pSVar7;
  int local_38;
  uint local_34;
  int dynamic_precedence;
  uint node_count;
  int32_t dynamic_precedence_1;
  int j;
  StackLink *existing_link;
  int i;
  SubtreePool *subtree_pool_local;
  StackNode *self_local;
  
  if (link.node != self) {
    for (existing_link._4_4_ = 0; existing_link._4_4_ < (int)(uint)self->link_count;
        existing_link._4_4_ = existing_link._4_4_ + 1) {
      pSVar7 = self->links + existing_link._4_4_;
      _Var3 = stack__subtree_is_equivalent(pSVar7->subtree,link.subtree);
      if (_Var3) {
        if (pSVar7->node == link.node) {
          iVar4 = ts_subtree_dynamic_precedence(link.subtree);
          iVar5 = ts_subtree_dynamic_precedence(pSVar7->subtree);
          if (iVar4 <= iVar5) {
            return;
          }
          ts_subtree_retain(link.subtree);
          ts_subtree_release(subtree_pool,pSVar7->subtree);
          pSVar7->subtree = link.subtree;
          iVar2 = (link.node)->dynamic_precedence;
          iVar4 = ts_subtree_dynamic_precedence(link.subtree);
          self->dynamic_precedence = iVar2 + iVar4;
          return;
        }
        if ((pSVar7->node->state == (link.node)->state) &&
           ((pSVar7->node->position).bytes == ((link.node)->position).bytes)) {
          for (node_count = 0; (int)node_count < (int)(uint)(link.node)->link_count;
              node_count = node_count + 1) {
            stack_node_add_link(pSVar7->node,(link.node)->links[(int)node_count],subtree_pool);
          }
          dynamic_precedence = (link.node)->dynamic_precedence;
          if (link.subtree.ptr != (SubtreeHeapData *)0x0) {
            iVar4 = ts_subtree_dynamic_precedence(link.subtree);
            dynamic_precedence = iVar4 + dynamic_precedence;
          }
          if (dynamic_precedence <= self->dynamic_precedence) {
            return;
          }
          self->dynamic_precedence = dynamic_precedence;
          return;
        }
      }
    }
    if (self->link_count != 8) {
      stack_node_retain(link.node);
      local_34 = (link.node)->node_count;
      local_38 = (link.node)->dynamic_precedence;
      uVar1 = self->link_count;
      self->link_count = uVar1 + 1;
      pSVar7 = self->links + uVar1;
      pSVar7->node = link.node;
      pSVar7->subtree = link.subtree;
      pSVar7->is_pending = link.is_pending;
      *(undefined7 *)&pSVar7->field_0x11 = link._17_7_;
      if (link.subtree.ptr != (SubtreeHeapData *)0x0) {
        ts_subtree_retain(link.subtree);
        uVar6 = ts_subtree_node_count(link.subtree);
        local_34 = uVar6 + local_34;
        iVar4 = ts_subtree_dynamic_precedence(link.subtree);
        local_38 = iVar4 + local_38;
      }
      if (self->node_count < local_34) {
        self->node_count = local_34;
      }
      if (self->dynamic_precedence < local_38) {
        self->dynamic_precedence = local_38;
      }
    }
  }
  return;
}

Assistant:

static void stack_node_add_link(StackNode *self, StackLink link, SubtreePool *subtree_pool) {
  if (link.node == self) return;

  for (int i = 0; i < self->link_count; i++) {
    StackLink *existing_link = &self->links[i];
    if (stack__subtree_is_equivalent(existing_link->subtree, link.subtree)) {
      // In general, we preserve ambiguities until they are removed from the stack
      // during a pop operation where multiple paths lead to the same node. But in
      // the special case where two links directly connect the same pair of nodes,
      // we can safely remove the ambiguity ahead of time without changing behavior.
      if (existing_link->node == link.node) {
        if (
          ts_subtree_dynamic_precedence(link.subtree) >
          ts_subtree_dynamic_precedence(existing_link->subtree)
        ) {
          ts_subtree_retain(link.subtree);
          ts_subtree_release(subtree_pool, existing_link->subtree);
          existing_link->subtree = link.subtree;
          self->dynamic_precedence =
            link.node->dynamic_precedence + ts_subtree_dynamic_precedence(link.subtree);
        }
        return;
      }

      // If the previous nodes are mergeable, merge them recursively.
      if (existing_link->node->state == link.node->state &&
          existing_link->node->position.bytes == link.node->position.bytes) {
        for (int j = 0; j < link.node->link_count; j++) {
          stack_node_add_link(existing_link->node, link.node->links[j], subtree_pool);
        }
        int32_t dynamic_precedence = link.node->dynamic_precedence;
        if (link.subtree.ptr) {
          dynamic_precedence += ts_subtree_dynamic_precedence(link.subtree);
        }
        if (dynamic_precedence > self->dynamic_precedence) {
          self->dynamic_precedence = dynamic_precedence;
        }
        return;
      }
    }
  }

  if (self->link_count == MAX_LINK_COUNT) return;

  stack_node_retain(link.node);
  unsigned node_count = link.node->node_count;
  int dynamic_precedence = link.node->dynamic_precedence;
  self->links[self->link_count++] = link;

  if (link.subtree.ptr) {
    ts_subtree_retain(link.subtree);
    node_count += ts_subtree_node_count(link.subtree);
    dynamic_precedence += ts_subtree_dynamic_precedence(link.subtree);
  }

  if (node_count > self->node_count) self->node_count = node_count;
  if (dynamic_precedence > self->dynamic_precedence) self->dynamic_precedence = dynamic_precedence;
}